

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::MethodDescriptor::GetSourceLocation
          (MethodDescriptor *this,SourceLocation *out_location)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> path;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetLocationPath(this,(vector<int,_std::allocator<int>_> *)&local_28);
  bVar1 = FileDescriptor::GetSourceLocation
                    (*(FileDescriptor **)(*(long *)(this + 0x10) + 0x10),
                     (vector<int,_std::allocator<int>_> *)&local_28,out_location);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return bVar1;
}

Assistant:

bool MethodDescriptor::GetSourceLocation(SourceLocation* out_location) const {
  std::vector<int> path;
  GetLocationPath(&path);
  return service()->file()->GetSourceLocation(path, out_location);
}